

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cc
# Opt level: O3

void __thiscall fizplex::Base::swap_columns(Base *this,size_t i,size_t j)

{
  pointer pEVar1;
  pointer pNVar2;
  size_t sVar3;
  void *pvVar4;
  pointer pNVar5;
  unsigned_long *puVar6;
  unsigned_long uVar7;
  undefined8 uVar8;
  pointer pNVar9;
  
  if ((i < this->m) && (j < this->m)) {
    pEVar1 = (this->etms).
             super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>._M_impl.
             super__Vector_impl_data._M_start;
    pNVar2 = *(pointer *)((long)&pEVar1[i].eta.values + 0x10);
    uVar8 = *(undefined8 *)&pEVar1[i].eta.values;
    pNVar9 = *(pointer *)((long)&pEVar1[i].eta.values + 8);
    *(undefined8 *)&pEVar1[i].eta.values = 0;
    *(pointer *)((long)&pEVar1[i].eta.values + 8) = (pointer)0x0;
    *(pointer *)((long)&pEVar1[i].eta.values + 0x10) = (pointer)0x0;
    sVar3 = pEVar1[i].col;
    std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>::
    _M_move_assign((vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_> *)
                   (pEVar1 + i));
    pEVar1[i].col = pEVar1[j].col;
    pvVar4 = *(void **)&pEVar1[j].eta.values;
    pNVar5 = *(pointer *)((long)&pEVar1[j].eta.values + 0x10);
    *(undefined8 *)&pEVar1[j].eta.values = uVar8;
    *(pointer *)((long)&pEVar1[j].eta.values + 8) = pNVar9;
    *(pointer *)((long)&pEVar1[j].eta.values + 0x10) = pNVar2;
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,(long)pNVar5 - (long)pvVar4);
    }
    pEVar1[j].col = sVar3;
    pEVar1 = (this->etms).
             super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>._M_impl.
             super__Vector_impl_data._M_start;
    pEVar1[i].col = i;
    pEVar1[j].col = j;
    puVar6 = (this->row_ordering)._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
    uVar7 = puVar6[i];
    puVar6[i] = puVar6[j];
    puVar6[j] = uVar7;
    return;
  }
  __assert_fail("i < m && j < m",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/base.cc"
                ,0x1c,"void fizplex::Base::swap_columns(size_t, size_t)");
}

Assistant:

void Base::swap_columns(size_t i, size_t j) {
  assert(i < m && j < m);
  std::swap(etms[i], etms[j]);
  etms[i].col = i;
  etms[j].col = j;
  std::swap<size_t>(row_ordering[i], row_ordering[j]);
}